

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.cpp
# Opt level: O3

void __thiscall Kdtree::print_data(Kdtree *this,vector<float,_std::allocator<float>_> *pt)

{
  pointer pfVar1;
  ostream *poVar2;
  ulong uVar3;
  
  pfVar1 = (pt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((pt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pfVar1) {
    uVar3 = 0;
    do {
      poVar2 = std::ostream::_M_insert<double>((double)pfVar1[uVar3]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      uVar3 = uVar3 + 1;
      pfVar1 = (pt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(pt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pfVar1 >> 2));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  return;
}

Assistant:

void Kdtree::print_data(std::vector<numType> pt)
{
	for( auto i = 0; i < pt.size(); i++)
	{
	    std::cout<< pt[i] << ", ";
	}
	std::cout<<"\n";
}